

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

CallbackResult __thiscall EntryBTree::traverseCallback(EntryBTree *this,uint8_t *data)

{
  uint8_t *puVar1;
  ostream *poVar2;
  KeyType obj;
  
  obj.m_flags = 0;
  obj.m_nameIndex = 0xffffffff;
  obj.m_extIndex = 0xffffffff;
  obj.m_linkIndex = 0xffffffff;
  puVar1 = parseData(this,&obj,data);
  if (puVar1 == (uint8_t *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Cannot parse Entry object.");
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return CONTINUE;
}

Assistant:

EntryBTree::CallbackResult EntryBTree::traverseCallback(const uint8_t* data) const
{
	CallbackResult result = CallbackResult::CONTINUE;

	KeyType obj;
	if (parseData(obj, data)) {
		std::cout << obj.nameIndex() << ":" << obj.extIndex() << ":" << obj.linkIndex() << std::endl;
	} else {
		std::cerr << "Cannot parse Entry object." << std::endl;
	}

	return result;
}